

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

string * __thiscall Json::Value::asString_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  char *pcVar1;
  runtime_error *this_00;
  LargestUInt in_RDX;
  char *local_60;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  Value *local_18;
  Value *this_local;
  
  local_18 = this;
  this_local = (Value *)__return_storage_ptr__;
  switch(this->field_0x8) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
    break;
  case 1:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,in_RDX);
    break;
  case 2:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,in_RDX);
    break;
  case 3:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)this,(this->value_).real_);
    break;
  case 4:
    if ((this->value_).int_ == 0) {
      local_60 = "";
    }
    else {
      local_60 = (this->value_).string_;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_60,local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
    break;
  case 5:
    pcVar1 = "false";
    if (((this->value_).bool_ & 1U) != 0) {
      pcVar1 = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Type is not convertible to string");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Value::asString() const {
  switch (type_) {
  case nullValue:
    return "";
  case stringValue:
    return value_.string_ ? value_.string_ : "";
  case booleanValue:
    return value_.bool_ ? "true" : "false";
  case intValue:
    return valueToString(value_.int_);
  case uintValue:
    return valueToString(value_.uint_);
  case realValue:
    return valueToString(value_.real_);
  default:
    JSON_FAIL_MESSAGE("Type is not convertible to string");
  }
}